

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

shared_ptr<aeron::archive::AeronArchive> aeron::archive::AeronArchive::asyncConnect(Context *ctx)

{
  ArchiveException *this;
  char *pcVar1;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  this = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_38,"not implemented",&local_79);
  std::__cxx11::string::string
            ((string *)&local_58,
             "static std::shared_ptr<AeronArchive> aeron::archive::AeronArchive::asyncConnect(const Context &)"
             ,&local_7a);
  pcVar1 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_78,pcVar1,&local_7b);
  ArchiveException::ArchiveException(this,&local_38,&local_58,&local_78,0x55);
  __cxa_throw(this,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::shared_ptr<AeronArchive> AeronArchive::asyncConnect(const Context& ctx) {
    throw ArchiveException("not implemented", SOURCEINFO);
}